

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O2

DynamicProfileInfo *
Js::DynamicProfileInfo::Deserialize<Js::BufferReader>
          (BufferReader *reader,Recycler *recycler,LocalFunctionId *functionId)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  BVIndex BVar4;
  Recycler *pRVar5;
  ValueType *data_00;
  LdLenInfo *data_01;
  undefined4 *puVar6;
  DynamicProfileFunctionInfo *ptr;
  undefined1 local_f0 [8];
  TrackAllocData data;
  StElemInfo *local_c0;
  ArrayCallSiteInfo *local_b8;
  FldInfo *local_b0;
  ValueType *local_a8;
  CallSiteInfo *local_a0;
  CallSiteInfo *local_98;
  ValueType *local_90;
  ValueType *local_88;
  ValueType *local_80;
  ImplicitCallFlags *local_78;
  Bits local_6d;
  BVFixed *pBStack_68;
  Bits bits;
  uint local_5c;
  AutoNestedHandledExceptionType local_58;
  uint32 recursiveInlineInfo;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  ThisInfo thisInfo;
  uint fldInfoCount;
  uint loopCount;
  Type TStack_40;
  ImplicitCallFlags implicitCallFlags;
  ArgSlot paramInfoCount;
  ProfileId ldLenInfoCount;
  ProfileId ldElemInfoCount;
  ProfileId stElemInfoCount;
  ProfileId arrayCallSiteCount;
  ProfileId slotInfoCount;
  ProfileId callSiteInfoCount;
  ProfileId callApplyTargetInfoCount;
  ProfileId returnTypeInfoCount;
  ProfileId divCount;
  ProfileId switchCount;
  
  fldInfoCount._2_2_ = 0;
  loopCount._0_2_ = 0;
  loopCount._2_2_ = 0;
  TStack_40 = 0;
  paramInfoCount = 0;
  ldLenInfoCount = 0;
  ldElemInfoCount = 0;
  stElemInfoCount = 0;
  arrayCallSiteCount = 0;
  slotInfoCount = 0;
  callSiteInfoCount = 0;
  __autoNestedHandledExceptionType.savedData.handledExceptionType = (Data)ExceptionType_None;
  thisInfo.valueType.field_0 = (anon_union_2_4_ea848c7b_for_ValueType_13)0x0;
  thisInfo.thisType = ThisType_Unknown;
  thisInfo._3_1_ = 0;
  ThisInfo::ThisInfo((ThisInfo *)&recursiveInlineInfo);
  local_5c = 0;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (&local_58,ExceptionType_OutOfMemory);
  bVar2 = BufferReader::Read<unsigned_int>(reader,functionId);
  if (bVar2) {
    bVar2 = BufferReader::Read<unsigned_short>(reader,(unsigned_short *)((long)&fldInfoCount + 2));
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                  ,0x8cc,"(false)","false");
      goto LAB_0088c240;
    }
    if ((ulong)fldInfoCount._2_2_ == 0) {
      data_00 = (ValueType *)0x0;
LAB_0088c259:
      bVar3 = BufferReader::Read<unsigned_short>(reader,(unsigned_short *)&loopCount);
      bVar2 = true;
      if (bVar3) {
        if ((ulong)(Type)loopCount == 0) {
          data_01 = (LdLenInfo *)0x0;
        }
        else {
          local_f0 = (undefined1  [8])&LdLenInfo::typeinfo;
          data.typeinfo = (type_info *)0x0;
          data.count = (size_t)anon_var_dwarf_4871496;
          data.filename._0_4_ = 0x8e0;
          data.plusSize = (ulong)(Type)loopCount;
          pRVar5 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_f0);
          data_01 = Memory::AllocateArray<Memory::Recycler,Js::LdLenInfo,false>
                              ((Memory *)pRVar5,(Recycler *)Memory::Recycler::AllocLeaf,0,
                               (ulong)(Type)loopCount);
          bVar3 = BufferReader::ReadArray<Js::LdLenInfo>(reader,data_01,(ulong)(Type)loopCount);
          if (!bVar3) goto LAB_0088c98a;
        }
        bVar3 = BufferReader::Read<unsigned_short>(reader,(unsigned_short *)((long)&loopCount + 2));
        if (bVar3) {
          if ((ulong)loopCount._2_2_ == 0) {
            data.line = 0;
            data._36_4_ = 0;
          }
          else {
            local_f0 = (undefined1  [8])&LdElemInfo::typeinfo;
            data.typeinfo = (type_info *)0x0;
            data.count = (size_t)anon_var_dwarf_4871496;
            data.filename._0_4_ = 0x8ee;
            data.plusSize = (ulong)loopCount._2_2_;
            pRVar5 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_f0);
            data._32_8_ = Memory::AllocateArray<Memory::Recycler,Js::LdElemInfo,false>
                                    ((Memory *)pRVar5,(Recycler *)Memory::Recycler::AllocLeaf,0,
                                     (ulong)loopCount._2_2_);
            bVar3 = BufferReader::ReadArray<Js::LdElemInfo>
                              (reader,(LdElemInfo *)data._32_8_,(ulong)loopCount._2_2_);
            if (!bVar3) goto LAB_0088c98a;
          }
          bVar3 = BufferReader::Read<unsigned_short>(reader,&stack0xffffffffffffffc0);
          if (bVar3) {
            if ((ulong)TStack_40 == 0) {
              local_c0 = (StElemInfo *)0x0;
            }
            else {
              local_f0 = (undefined1  [8])&StElemInfo::typeinfo;
              data.typeinfo = (type_info *)0x0;
              data.count = (size_t)anon_var_dwarf_4871496;
              data.filename._0_4_ = 0x8fc;
              data.plusSize = (ulong)TStack_40;
              pRVar5 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_f0);
              local_c0 = Memory::AllocateArray<Memory::Recycler,Js::StElemInfo,false>
                                   ((Memory *)pRVar5,(Recycler *)Memory::Recycler::AllocLeaf,0,
                                    (ulong)TStack_40);
              bVar3 = BufferReader::ReadArray<Js::StElemInfo>(reader,local_c0,(ulong)TStack_40);
              if (!bVar3) goto LAB_0088c98a;
            }
            bVar3 = BufferReader::Read<unsigned_short>(reader,&paramInfoCount);
            if (bVar3) {
              if ((ulong)paramInfoCount == 0) {
                local_b8 = (ArrayCallSiteInfo *)0x0;
              }
              else {
                local_f0 = (undefined1  [8])&ArrayCallSiteInfo::typeinfo;
                data.typeinfo = (type_info *)0x0;
                data.count = (size_t)anon_var_dwarf_4871496;
                data.filename._0_4_ = 0x90a;
                data.plusSize = (ulong)paramInfoCount;
                pRVar5 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_f0);
                local_b8 = Memory::AllocateArray<Memory::Recycler,Js::ArrayCallSiteInfo,false>
                                     ((Memory *)pRVar5,(Recycler *)Memory::Recycler::AllocLeaf,0,
                                      (ulong)paramInfoCount);
                bVar3 = BufferReader::ReadArray<Js::ArrayCallSiteInfo>
                                  (reader,local_b8,(ulong)paramInfoCount);
                if (!bVar3) goto LAB_0088c98a;
              }
              bVar3 = BufferReader::Read<unsigned_int>
                                (reader,(uint *)&__autoNestedHandledExceptionType);
              if (bVar3) {
                if ((ulong)(uint)__autoNestedHandledExceptionType.savedData.handledExceptionType ==
                    0) {
                  local_b0 = (FldInfo *)0x0;
                }
                else {
                  local_f0 = (undefined1  [8])&FldInfo::typeinfo;
                  data.typeinfo = (type_info *)0x0;
                  data.count = (size_t)anon_var_dwarf_4871496;
                  data.filename._0_4_ = 0x918;
                  data.plusSize =
                       (ulong)(uint)__autoNestedHandledExceptionType.savedData.handledExceptionType;
                  pRVar5 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_f0);
                  local_b0 = Memory::AllocateArray<Memory::Recycler,Js::FldInfo,false>
                                       ((Memory *)pRVar5,(Recycler *)Memory::Recycler::AllocLeaf,0,
                                        (ulong)(uint)__autoNestedHandledExceptionType.savedData.
                                                     handledExceptionType);
                  bVar3 = BufferReader::ReadArray<Js::FldInfo>
                                    (reader,local_b0,
                                     (ulong)(uint)__autoNestedHandledExceptionType.savedData.
                                                  handledExceptionType);
                  if (!bVar3) goto LAB_0088c98a;
                }
                bVar3 = BufferReader::Read<unsigned_short>(reader,&ldLenInfoCount);
                if (bVar3) {
                  if ((ulong)ldLenInfoCount == 0) {
                    local_a8 = (ValueType *)0x0;
                  }
                  else {
                    local_f0 = (undefined1  [8])&ValueType::typeinfo;
                    data.typeinfo = (type_info *)0x0;
                    data.count = (size_t)anon_var_dwarf_4871496;
                    data.filename._0_4_ = 0x926;
                    data.plusSize = (ulong)ldLenInfoCount;
                    pRVar5 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_f0);
                    local_a8 = Memory::AllocateArray<Memory::Recycler,ValueType,false>
                                         ((Memory *)pRVar5,(Recycler *)Memory::Recycler::AllocLeaf,0
                                          ,(ulong)ldLenInfoCount);
                    bVar3 = BufferReader::ReadArray<ValueType>
                                      (reader,local_a8,(ulong)ldLenInfoCount);
                    if (!bVar3) goto LAB_0088c98a;
                  }
                  bVar3 = BufferReader::Read<unsigned_short>(reader,&ldElemInfoCount);
                  if (bVar3) {
                    if ((ulong)ldElemInfoCount == 0) {
                      local_a0 = (CallSiteInfo *)0x0;
                    }
                    else {
                      local_f0 = (undefined1  [8])&CallSiteInfo::typeinfo;
                      data.typeinfo = (type_info *)0x0;
                      data.count = (size_t)anon_var_dwarf_4871496;
                      data.filename._0_4_ = 0x937;
                      data.plusSize = (ulong)ldElemInfoCount;
                      pRVar5 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_f0)
                      ;
                      local_a0 = Memory::AllocateArray<Memory::Recycler,Js::CallSiteInfo,false>
                                           ((Memory *)pRVar5,(Recycler *)Memory::Recycler::AllocLeaf
                                            ,0,(ulong)ldElemInfoCount);
                      bVar3 = BufferReader::ReadArray<Js::CallSiteInfo>
                                        (reader,local_a0,(ulong)ldElemInfoCount);
                      if (!bVar3) goto LAB_0088c98a;
                    }
                    bVar3 = BufferReader::Read<unsigned_short>(reader,&stElemInfoCount);
                    if (bVar3) {
                      if ((ulong)stElemInfoCount == 0) {
                        local_98 = (CallSiteInfo *)0x0;
                      }
                      else {
                        local_f0 = (undefined1  [8])&CallSiteInfo::typeinfo;
                        data.typeinfo = (type_info *)0x0;
                        data.count = (size_t)anon_var_dwarf_4871496;
                        data.filename._0_4_ = 0x948;
                        data.plusSize = (ulong)stElemInfoCount;
                        pRVar5 = Memory::Recycler::TrackAllocInfo
                                           (recycler,(TrackAllocData *)local_f0);
                        local_98 = Memory::AllocateArray<Memory::Recycler,Js::CallSiteInfo,false>
                                             ((Memory *)pRVar5,
                                              (Recycler *)Memory::Recycler::AllocLeaf,0,
                                              (ulong)stElemInfoCount);
                        bVar3 = BufferReader::ReadArray<Js::CallSiteInfo>
                                          (reader,local_98,(ulong)stElemInfoCount);
                        if (!bVar3) goto LAB_0088c98a;
                      }
                      bVar3 = BufferReader::Read<unsigned_short>(reader,&slotInfoCount);
                      if (bVar3) {
                        if ((ulong)slotInfoCount == 0) {
                          local_90 = (ValueType *)0x0;
                        }
                        else {
                          local_f0 = (undefined1  [8])&ValueType::typeinfo;
                          data.typeinfo = (type_info *)0x0;
                          data.count = (size_t)anon_var_dwarf_4871496;
                          data.filename._0_4_ = 0x956;
                          data.plusSize = (ulong)slotInfoCount;
                          pRVar5 = Memory::Recycler::TrackAllocInfo
                                             (recycler,(TrackAllocData *)local_f0);
                          local_90 = Memory::AllocateArray<Memory::Recycler,ValueType,false>
                                               ((Memory *)pRVar5,
                                                (Recycler *)Memory::Recycler::AllocLeaf,0,
                                                (ulong)slotInfoCount);
                          bVar3 = BufferReader::ReadArray<ValueType>
                                            (reader,local_90,(ulong)slotInfoCount);
                          if (!bVar3) goto LAB_0088c98a;
                        }
                        bVar3 = BufferReader::Read<unsigned_short>(reader,&callSiteInfoCount);
                        if (bVar3) {
                          if ((ulong)callSiteInfoCount == 0) {
                            local_88 = (ValueType *)0x0;
                          }
                          else {
                            local_f0 = (undefined1  [8])&ValueType::typeinfo;
                            data.typeinfo = (type_info *)0x0;
                            data.count = (size_t)anon_var_dwarf_4871496;
                            data.filename._0_4_ = 0x964;
                            data.plusSize = (ulong)callSiteInfoCount;
                            pRVar5 = Memory::Recycler::TrackAllocInfo
                                               (recycler,(TrackAllocData *)local_f0);
                            local_88 = Memory::AllocateArray<Memory::Recycler,ValueType,false>
                                                 ((Memory *)pRVar5,
                                                  (Recycler *)Memory::Recycler::AllocLeaf,0,
                                                  (ulong)callSiteInfoCount);
                            bVar3 = BufferReader::ReadArray<ValueType>
                                              (reader,local_88,(ulong)callSiteInfoCount);
                            if (!bVar3) goto LAB_0088c98a;
                          }
                          bVar3 = BufferReader::Read<unsigned_short>(reader,&arrayCallSiteCount);
                          if (bVar3) {
                            if ((ulong)arrayCallSiteCount == 0) {
                              local_80 = (ValueType *)0x0;
                            }
                            else {
                              local_f0 = (undefined1  [8])&ValueType::typeinfo;
                              data.typeinfo = (type_info *)0x0;
                              data.count = (size_t)anon_var_dwarf_4871496;
                              data.filename._0_4_ = 0x972;
                              data.plusSize = (ulong)arrayCallSiteCount;
                              pRVar5 = Memory::Recycler::TrackAllocInfo
                                                 (recycler,(TrackAllocData *)local_f0);
                              local_80 = Memory::AllocateArray<Memory::Recycler,ValueType,false>
                                                   ((Memory *)pRVar5,
                                                    (Recycler *)Memory::Recycler::AllocLeaf,0,
                                                    (ulong)arrayCallSiteCount);
                              bVar3 = BufferReader::ReadArray<ValueType>
                                                (reader,local_80,(ulong)arrayCallSiteCount);
                              if (!bVar3) goto LAB_0088c98a;
                            }
                            bVar3 = BufferReader::Read<unsigned_int>(reader,(uint *)&thisInfo);
                            if (bVar3) {
                              if ((ulong)(uint)thisInfo == 0) {
                                local_78 = (ImplicitCallFlags *)0x0;
                              }
                              else {
                                local_f0 = (undefined1  [8])&ImplicitCallFlags::typeinfo;
                                data.typeinfo = (type_info *)0x0;
                                data.count = (size_t)anon_var_dwarf_4871496;
                                data.filename._0_4_ = 0x980;
                                data.plusSize = (ulong)(uint)thisInfo;
                                pRVar5 = Memory::Recycler::TrackAllocInfo
                                                   (recycler,(TrackAllocData *)local_f0);
                                local_78 = Memory::
                                           AllocateArray<Memory::Recycler,Js::ImplicitCallFlags,false>
                                                     ((Memory *)pRVar5,
                                                      (Recycler *)Memory::Recycler::AllocLeaf,0,
                                                      (ulong)(uint)thisInfo);
                                bVar3 = BufferReader::ReadArray<Js::ImplicitCallFlags>
                                                  (reader,local_78,(ulong)(uint)thisInfo);
                                if (!bVar3) goto LAB_0088c98a;
                              }
                              bVar3 = BufferReader::Read<Js::ImplicitCallFlags>
                                                (reader,(ImplicitCallFlags *)
                                                        ((long)&fldInfoCount + 1));
                              if ((((bVar3) &&
                                   (bVar3 = BufferReader::Read<Js::ThisInfo>
                                                      (reader,(ThisInfo *)&recursiveInlineInfo),
                                   bVar3)) &&
                                  (bVar3 = BufferReader::Read<Js::DynamicProfileInfo::Bits>
                                                     (reader,&local_6d), bVar3)) &&
                                 (bVar3 = BufferReader::Read<unsigned_int>(reader,&local_5c), bVar3)
                                 ) {
                                if (thisInfo == (ThisInfo)0x0) {
                                  pBStack_68 = (BVFixed *)0x0;
                                }
                                else {
                                  pBStack_68 = BVFixed::New<Memory::Recycler>
                                                         ((int)thisInfo * 2,recycler,false);
                                  BVar4 = BVFixed::WordCount(pBStack_68);
                                  bVar3 = BufferReader::ReadArray<BVUnitT<unsigned_long>>
                                                    (reader,(BVUnitT<unsigned_long> *)
                                                            (pBStack_68 + 1),(ulong)BVar4);
                                  if (!bVar3) goto LAB_0088c98a;
                                }
                                local_f0 = (undefined1  [8])&DynamicProfileFunctionInfo::typeinfo;
                                data.typeinfo = (type_info *)0x0;
                                data.plusSize = 0xffffffffffffffff;
                                data.count = (size_t)anon_var_dwarf_4871496;
                                data.filename._0_4_ = 0x998;
                                pRVar5 = Memory::Recycler::TrackAllocInfo
                                                   (recycler,(TrackAllocData *)local_f0);
                                ptr = (DynamicProfileFunctionInfo *)
                                      new<Memory::Recycler>(0x20,pRVar5,0x6db486);
                                ptr->paramInfoCount = fldInfoCount._2_2_;
                                ptr->ldLenInfoCount = (Type)loopCount;
                                ptr->ldElemInfoCount = loopCount._2_2_;
                                ptr->stElemInfoCount = TStack_40;
                                ptr->arrayCallSiteCount = paramInfoCount;
                                ptr->fldInfoCount =
                                     (Type)__autoNestedHandledExceptionType.savedData.
                                           handledExceptionType;
                                ptr->slotInfoCount = ldLenInfoCount;
                                ptr->callSiteInfoCount = ldElemInfoCount;
                                ptr->callApplyTargetInfoCount = stElemInfoCount;
                                ptr->divCount = slotInfoCount;
                                ptr->switchCount = callSiteInfoCount;
                                ptr->returnTypeInfoCount = arrayCallSiteCount;
                                ptr->loopCount = (Type)thisInfo;
                                local_f0 = (undefined1  [8])&typeinfo;
                                data.typeinfo = (type_info *)0x0;
                                data.plusSize = 0xffffffffffffffff;
                                data.count = (size_t)anon_var_dwarf_4871496;
                                data.filename._0_4_ = 0x9a7;
                                pRVar5 = Memory::Recycler::TrackAllocInfo
                                                   (recycler,(TrackAllocData *)local_f0);
                                reader = (BufferReader *)new<Memory::Recycler>(0xa8,pRVar5,0x37a1d4)
                                ;
                                DynamicProfileInfo((DynamicProfileInfo *)reader);
                                Memory::WriteBarrierPtr<Js::DynamicProfileFunctionInfo>::
                                WriteBarrierSet((WriteBarrierPtr<Js::DynamicProfileFunctionInfo> *)
                                                reader,ptr);
                                Memory::WriteBarrierPtr<ValueType>::WriteBarrierSet
                                          (&((DynamicProfileInfo *)reader)->parameterInfo,data_00);
                                Memory::WriteBarrierPtr<Js::LdLenInfo>::WriteBarrierSet
                                          (&((DynamicProfileInfo *)reader)->ldLenInfo,data_01);
                                Memory::WriteBarrierPtr<Js::LdElemInfo>::WriteBarrierSet
                                          (&((DynamicProfileInfo *)reader)->ldElemInfo,
                                           (LdElemInfo *)data._32_8_);
                                Memory::WriteBarrierPtr<Js::StElemInfo>::WriteBarrierSet
                                          (&((DynamicProfileInfo *)reader)->stElemInfo,local_c0);
                                Memory::WriteBarrierPtr<Js::ArrayCallSiteInfo>::WriteBarrierSet
                                          (&((DynamicProfileInfo *)reader)->arrayCallSiteInfo,
                                           local_b8);
                                Memory::WriteBarrierPtr<Js::FldInfo>::WriteBarrierSet
                                          (&((DynamicProfileInfo *)reader)->fldInfo,local_b0);
                                Memory::WriteBarrierPtr<ValueType>::WriteBarrierSet
                                          (&((DynamicProfileInfo *)reader)->slotInfo,local_a8);
                                Memory::WriteBarrierPtr<Js::CallSiteInfo>::WriteBarrierSet
                                          (&((DynamicProfileInfo *)reader)->callSiteInfo,local_a0);
                                Memory::WriteBarrierPtr<Js::CallSiteInfo>::WriteBarrierSet
                                          (&((DynamicProfileInfo *)reader)->callApplyTargetInfo,
                                           local_98);
                                Memory::WriteBarrierPtr<ValueType>::WriteBarrierSet
                                          (&((DynamicProfileInfo *)reader)->divideTypeInfo,local_90)
                                ;
                                Memory::WriteBarrierPtr<ValueType>::WriteBarrierSet
                                          (&((DynamicProfileInfo *)reader)->switchTypeInfo,local_88)
                                ;
                                Memory::WriteBarrierPtr<ValueType>::WriteBarrierSet
                                          (&((DynamicProfileInfo *)reader)->returnTypeInfo,local_80)
                                ;
                                Memory::WriteBarrierPtr<Js::ImplicitCallFlags>::WriteBarrierSet
                                          (&((DynamicProfileInfo *)reader)->loopImplicitCallFlags,
                                           local_78);
                                ((DynamicProfileInfo *)reader)->implicitCallFlags =
                                     fldInfoCount._1_1_;
                                Memory::WriteBarrierPtr<BVFixed>::WriteBarrierSet
                                          (&((DynamicProfileInfo *)reader)->loopFlags,pBStack_68);
                                (((DynamicProfileInfo *)reader)->thisInfo).thisType =
                                     recursiveInlineInfo._2_1_;
                                (((DynamicProfileInfo *)reader)->thisInfo).valueType.field_0 =
                                     recursiveInlineInfo._0_2_;
                                *(undefined4 *)&((DynamicProfileInfo *)reader)->bits =
                                     local_6d._0_4_;
                                (((DynamicProfileInfo *)reader)->bits).field_0x4 = local_6d._4_1_;
                                ((DynamicProfileInfo *)reader)->m_recursiveInlineInfo = local_5c;
                                ResetAllPolymorphicCallSiteInfo((DynamicProfileInfo *)reader);
                                bVar2 = false;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      local_f0 = (undefined1  [8])&ValueType::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.count = (size_t)anon_var_dwarf_4871496;
      data.filename._0_4_ = 0x8d2;
      data.plusSize = (ulong)fldInfoCount._2_2_;
      pRVar5 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_f0);
      data_00 = Memory::AllocateArray<Memory::Recycler,ValueType,false>
                          ((Memory *)pRVar5,(Recycler *)Memory::Recycler::AllocLeaf,0,
                           (ulong)fldInfoCount._2_2_);
      bVar2 = BufferReader::ReadArray<ValueType>(reader,data_00,(ulong)fldInfoCount._2_2_);
      if (bVar2) goto LAB_0088c259;
      bVar2 = true;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x8c6,"(false)","false");
LAB_0088c240:
    if (bVar2 == false) goto LAB_0088c9fd;
    *puVar6 = 0;
    bVar2 = false;
    reader = (BufferReader *)0x0;
  }
LAB_0088c98a:
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_58);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x9c6,"(false)","false");
    if (!bVar2) {
LAB_0088c9fd:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
    reader = (BufferReader *)0x0;
  }
  return (DynamicProfileInfo *)reader;
}

Assistant:

DynamicProfileInfo * DynamicProfileInfo::Deserialize(T * reader, Recycler* recycler, Js::LocalFunctionId * functionId)
    {
        Js::ArgSlot paramInfoCount = 0;
        ProfileId ldLenInfoCount = 0;
        ProfileId ldElemInfoCount = 0;
        ProfileId stElemInfoCount = 0;
        ProfileId arrayCallSiteCount = 0;
        ProfileId slotInfoCount = 0;
        ProfileId callSiteInfoCount = 0;
        ProfileId callApplyTargetInfoCount = 0;
        ProfileId returnTypeInfoCount = 0;
        ProfileId divCount = 0;
        ProfileId switchCount = 0;
        uint fldInfoCount = 0;
        uint loopCount = 0;
        ValueType * paramInfo = nullptr;
        LdLenInfo * ldLenInfo = nullptr;
        LdElemInfo * ldElemInfo = nullptr;
        StElemInfo * stElemInfo = nullptr;
        ArrayCallSiteInfo * arrayCallSiteInfo = nullptr;
        FldInfo * fldInfo = nullptr;
        ValueType * slotInfo = nullptr;
        CallSiteInfo * callSiteInfo = nullptr;
        CallSiteInfo * callApplyTargetInfo = nullptr;
        ValueType * divTypeInfo = nullptr;
        ValueType * switchTypeInfo = nullptr;
        ValueType * returnTypeInfo = nullptr;
        ImplicitCallFlags * loopImplicitCallFlags = nullptr;
        BVFixed * loopFlags = nullptr;
        ImplicitCallFlags implicitCallFlags;
        ThisInfo thisInfo;
        Bits bits;
        uint32 recursiveInlineInfo = 0;

        try
        {
            AUTO_NESTED_HANDLED_EXCEPTION_TYPE(ExceptionType_OutOfMemory);

            if (!reader->Read(functionId))
            {
                AssertOrFailFast(false);
                return nullptr;
            }

            if (!reader->Read(&paramInfoCount))
            {
                AssertOrFailFast(false);
                return nullptr;
            }

            if (paramInfoCount != 0)
            {
                paramInfo = RecyclerNewArrayLeaf(recycler, ValueType, paramInfoCount);
                if (!reader->ReadArray(paramInfo, paramInfoCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&ldLenInfoCount))
            {
                goto Error;
            }

            if (ldLenInfoCount != 0)
            {
                ldLenInfo = RecyclerNewArrayLeaf(recycler, LdLenInfo, ldLenInfoCount);
                if (!reader->ReadArray(ldLenInfo, ldLenInfoCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&ldElemInfoCount))
            {
                goto Error;
            }

            if (ldElemInfoCount != 0)
            {
                ldElemInfo = RecyclerNewArrayLeaf(recycler, LdElemInfo, ldElemInfoCount);
                if (!reader->ReadArray(ldElemInfo, ldElemInfoCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&stElemInfoCount))
            {
                goto Error;
            }

            if (stElemInfoCount != 0)
            {
                stElemInfo = RecyclerNewArrayLeaf(recycler, StElemInfo, stElemInfoCount);
                if (!reader->ReadArray(stElemInfo, stElemInfoCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&arrayCallSiteCount))
            {
                goto Error;
            }

            if (arrayCallSiteCount != 0)
            {
                arrayCallSiteInfo = RecyclerNewArrayLeaf(recycler, ArrayCallSiteInfo, arrayCallSiteCount);
                if (!reader->ReadArray(arrayCallSiteInfo, arrayCallSiteCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&fldInfoCount))
            {
                goto Error;
            }

            if (fldInfoCount != 0)
            {
                fldInfo = RecyclerNewArrayLeaf(recycler, FldInfo, fldInfoCount);
                if (!reader->ReadArray(fldInfo, fldInfoCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&slotInfoCount))
            {
                goto Error;
            }

            if (slotInfoCount != 0)
            {
                slotInfo = RecyclerNewArrayLeaf(recycler, ValueType, slotInfoCount);
                if (!reader->ReadArray(slotInfo, slotInfoCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&callSiteInfoCount))
            {
                goto Error;
            }

            if (callSiteInfoCount != 0)
            {
                // CallSiteInfo contains pointer "polymorphicCallSiteInfo", but
                // we explicitly save that pointer in FunctionBody. Safe to
                // allocate CallSiteInfo[] as Leaf here.
                callSiteInfo = RecyclerNewArrayLeaf(recycler, CallSiteInfo, callSiteInfoCount);
                if (!reader->ReadArray(callSiteInfo, callSiteInfoCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&callApplyTargetInfoCount))
            {
                goto Error;
            }

            if (callApplyTargetInfoCount != 0)
            {
                // CallSiteInfo contains pointer "polymorphicCallSiteInfo", but
                // we explicitly save that pointer in FunctionBody. Safe to
                // allocate CallSiteInfo[] as Leaf here.
                callApplyTargetInfo = RecyclerNewArrayLeaf(recycler, CallSiteInfo, callApplyTargetInfoCount);
                if (!reader->ReadArray(callApplyTargetInfo, callApplyTargetInfoCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&divCount))
            {
                goto Error;
            }

            if (divCount != 0)
            {
                divTypeInfo = RecyclerNewArrayLeaf(recycler, ValueType, divCount);
                if (!reader->ReadArray(divTypeInfo, divCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&switchCount))
            {
                goto Error;
            }

            if (switchCount != 0)
            {
                switchTypeInfo = RecyclerNewArrayLeaf(recycler, ValueType, switchCount);
                if (!reader->ReadArray(switchTypeInfo, switchCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&returnTypeInfoCount))
            {
                goto Error;
            }

            if (returnTypeInfoCount != 0)
            {
                returnTypeInfo = RecyclerNewArrayLeaf(recycler, ValueType, returnTypeInfoCount);
                if (!reader->ReadArray(returnTypeInfo, returnTypeInfoCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&loopCount))
            {
                goto Error;
            }

            if (loopCount != 0)
            {
                loopImplicitCallFlags = RecyclerNewArrayLeaf(recycler, ImplicitCallFlags, loopCount);
                if (!reader->ReadArray(loopImplicitCallFlags, loopCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&implicitCallFlags) ||
                !reader->Read(&thisInfo) ||
                !reader->Read(&bits) ||
                !reader->Read(&recursiveInlineInfo))
            {
                goto Error;
            }

            if (loopCount != 0)
            {
                loopFlags = BVFixed::New(loopCount * LoopFlags::COUNT, recycler);
                if (!reader->ReadArray(loopFlags->GetData(), loopFlags->WordCount()))
                {
                    goto Error;
                }
            }

            DynamicProfileFunctionInfo * dynamicProfileFunctionInfo = RecyclerNewStructLeaf(recycler, DynamicProfileFunctionInfo);
            dynamicProfileFunctionInfo->paramInfoCount = paramInfoCount;
            dynamicProfileFunctionInfo->ldLenInfoCount = ldLenInfoCount;
            dynamicProfileFunctionInfo->ldElemInfoCount = ldElemInfoCount;
            dynamicProfileFunctionInfo->stElemInfoCount = stElemInfoCount;
            dynamicProfileFunctionInfo->arrayCallSiteCount = arrayCallSiteCount;
            dynamicProfileFunctionInfo->fldInfoCount = fldInfoCount;
            dynamicProfileFunctionInfo->slotInfoCount = slotInfoCount;
            dynamicProfileFunctionInfo->callSiteInfoCount = callSiteInfoCount;
            dynamicProfileFunctionInfo->callApplyTargetInfoCount = callApplyTargetInfoCount;
            dynamicProfileFunctionInfo->divCount = divCount;
            dynamicProfileFunctionInfo->switchCount = switchCount;
            dynamicProfileFunctionInfo->returnTypeInfoCount = returnTypeInfoCount;
            dynamicProfileFunctionInfo->loopCount = loopCount;

            DynamicProfileInfo * dynamicProfileInfo = RecyclerNew(recycler, DynamicProfileInfo);
            dynamicProfileInfo->dynamicProfileFunctionInfo = dynamicProfileFunctionInfo;
            dynamicProfileInfo->parameterInfo = paramInfo;
            dynamicProfileInfo->ldLenInfo = ldLenInfo;
            dynamicProfileInfo->ldElemInfo = ldElemInfo;
            dynamicProfileInfo->stElemInfo = stElemInfo;
            dynamicProfileInfo->arrayCallSiteInfo = arrayCallSiteInfo;
            dynamicProfileInfo->fldInfo = fldInfo;
            dynamicProfileInfo->slotInfo = slotInfo;
            dynamicProfileInfo->callSiteInfo = callSiteInfo;
            dynamicProfileInfo->callApplyTargetInfo = callApplyTargetInfo;
            dynamicProfileInfo->divideTypeInfo = divTypeInfo;
            dynamicProfileInfo->switchTypeInfo = switchTypeInfo;
            dynamicProfileInfo->returnTypeInfo = returnTypeInfo;
            dynamicProfileInfo->loopImplicitCallFlags = loopImplicitCallFlags;
            dynamicProfileInfo->implicitCallFlags = implicitCallFlags;
            dynamicProfileInfo->loopFlags = loopFlags;
            dynamicProfileInfo->thisInfo = thisInfo;
            dynamicProfileInfo->bits = bits;
            dynamicProfileInfo->m_recursiveInlineInfo = recursiveInlineInfo;

            // Fixed functions and object type data is not serialized. There is no point in trying to serialize polymorphic call site info.
            dynamicProfileInfo->ResetAllPolymorphicCallSiteInfo();

            return dynamicProfileInfo;
        }
        catch (OutOfMemoryException)
        {
        }

    Error:
        AssertOrFailFast(false);
        return nullptr;
    }